

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

int fp_r4stat(fitsfile *infptr,int naxis,long *naxes,imgstats *imagestats,int *status)

{
  undefined1 auVar1 [16];
  int iVar2;
  float *array;
  long lVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  size_t __nmemb;
  float nullvalue;
  float minvalue;
  long local_168;
  fitsfile *local_160;
  double noise5;
  double noise3;
  double noise2;
  double noise1;
  double mean;
  long ngood;
  int anynul;
  float maxvalue;
  double sigma;
  long lpixel [9];
  long fpixel [9];
  long inc [9];
  
  plVar5 = &DAT_001c9ce0;
  plVar6 = fpixel;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *plVar6 = *plVar5;
    plVar5 = plVar5 + 1;
    plVar6 = plVar6 + 1;
  }
  plVar5 = &DAT_001c9ce0;
  plVar6 = lpixel;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *plVar6 = *plVar5;
    plVar5 = plVar5 + 1;
    plVar6 = plVar6 + 1;
  }
  plVar5 = &DAT_001c9ce0;
  plVar6 = inc;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *plVar6 = *plVar5;
    plVar5 = plVar5 + 1;
    plVar6 = plVar6 + 1;
  }
  lVar3 = *naxes;
  lpixel[0] = (long)(XSAMPLE / 2) + lVar3 / 2;
  fpixel[0] = lVar3 / 2 - (long)(XSAMPLE / 2 + -1);
  if (fpixel[0] < 2) {
    fpixel[0] = 1;
  }
  if (lVar3 <= lpixel[0]) {
    lpixel[0] = lVar3;
  }
  lVar3 = lpixel[0] - fpixel[0];
  local_168 = lVar3 + 1;
  if (1 < naxis) {
    lVar3 = naxes[1];
    lpixel[1] = (long)(YSAMPLE / 2) + lVar3 / 2;
    lVar4 = lVar3 / 2 - (long)(YSAMPLE / 2 + -1);
    fpixel[1] = 1;
    if (1 < lVar4) {
      fpixel[1] = lVar4;
    }
    if (lVar3 <= lpixel[1]) {
      lpixel[1] = lVar3;
    }
    lVar3 = lpixel[1] - fpixel[1];
    if (naxis != 2) {
      lpixel[2] = naxes[2] / 2 + 1;
      fpixel[2] = lpixel[2];
    }
  }
  __nmemb = (lVar3 + 1) * local_168;
  local_160 = infptr;
  array = (float *)calloc(__nmemb,4);
  if (array == (float *)0x0) {
    *status = 0x71;
    iVar2 = 0x71;
  }
  else {
    ffgsve(local_160,0,naxis,naxes,fpixel,lpixel,inc,-9.11912e-36,array,&anynul,status);
    nullvalue = -9.11912e-36;
    if (anynul == 0) {
      nullvalue = 0.0;
    }
    fits_img_stats_float
              (array,local_168,lVar3 + 1,(uint)(anynul != 0),nullvalue,&ngood,&minvalue,&maxvalue,
               &mean,&sigma,&noise1,&noise2,&noise3,&noise5,status);
    imagestats->n_nulls = (int)__nmemb - (int)ngood;
    auVar1._8_4_ = SUB84((double)maxvalue,0);
    auVar1._0_8_ = (double)minvalue;
    auVar1._12_4_ = (int)((ulong)(double)maxvalue >> 0x20);
    imagestats->minval = (double)minvalue;
    imagestats->maxval = (double)auVar1._8_8_;
    imagestats->mean = mean;
    imagestats->sigma = sigma;
    imagestats->noise1 = noise1;
    imagestats->noise2 = noise2;
    imagestats->noise3 = noise3;
    imagestats->noise5 = noise5;
    free(array);
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int fp_r4stat(fitsfile *infptr, int naxis, long *naxes, imgstats *imagestats, int *status)
{
/*
    read the central XSAMPLE by YSAMPLE region of pixels in the int*2 image, 
    and then compute basic statistics: min, max, mean, sigma, mean diff, etc.
*/

	long fpixel[9] = {1,1,1,1,1,1,1,1,1};
	long lpixel[9] = {1,1,1,1,1,1,1,1,1};
	long inc[9]    = {1,1,1,1,1,1,1,1,1};
	long i1, i2, npix, ngood, nx, ny;
	float *array, minvalue, maxvalue, nullvalue = FLOATNULLVALUE;
	int anynul,checknull = 1;
	double mean, sigma, noise1, noise2, noise3, noise5;
	
         /* select the middle XSAMPLE by YSAMPLE area of the image */
	i1 = naxes[0]/2 - (XSAMPLE/2 - 1);
	i2 = naxes[0]/2 + (XSAMPLE/2);
	if (i1 < 1) i1 = 1;
	if (i2 > naxes[0]) i2 = naxes[0];
	fpixel[0] = i1;
	lpixel[0] = i2;
	nx = i2 - i1 +1;

        if (naxis > 1) {
	    i1 = naxes[1]/2 - (YSAMPLE/2 - 1);
	    i2 = naxes[1]/2 + (YSAMPLE/2);
	    if (i1 < 1) i1 = 1;
	    if (i2 > naxes[1]) i2 = naxes[1];
	    fpixel[1] = i1;
	    lpixel[1] = i2;
	}
	ny = i2 - i1 +1;

	npix = nx * ny;

        /* if there are higher dimensions, read the middle plane of the cube */
	if (naxis > 2) {
	    fpixel[2] = naxes[2]/2 + 1;
	    lpixel[2] = naxes[2]/2 + 1;
	}

	array = calloc(npix, sizeof(float));
	if (!array) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	fits_read_subset_flt(infptr, 0, naxis, naxes, fpixel, lpixel, inc,
	    nullvalue, array, &anynul, status);

	/* are there any null values in the array? */
	if (!anynul) {
	   nullvalue = 0.;
	   checknull = 0;
	}

	/* compute statistics of the image */

        fits_img_stats_float(array, nx, ny, checknull, nullvalue, 
	&ngood, &minvalue, &maxvalue, &mean, &sigma, &noise1, &noise2, &noise3, &noise5, status);

	imagestats->n_nulls = npix - ngood;
	imagestats->minval = minvalue;
	imagestats->maxval = maxvalue; 
	imagestats->mean = mean; 
	imagestats->sigma = sigma; 
	imagestats->noise1 = noise1; 
	imagestats->noise2 = noise2; 
	imagestats->noise3 = noise3; 
	imagestats->noise5 = noise5; 
    
	free(array);
	return(*status);
}